

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O1

size_t io::net::
       read<io::basic_string_stream<char,std::char_traits<char>>,io::net::dynamic_vector_buffer<char,std::allocator<char>>,io::net::transfer_exactly,void>
                 (basic_string_stream<char,_std::char_traits<char>_> *stream,
                 dynamic_vector_buffer<char,_std::allocator<char>_> *b,
                 transfer_exactly completion_condition)

{
  size_t sVar1;
  system_error *this;
  error_code __ec;
  error_code ec;
  error_code local_30;
  
  local_30._M_value = 0;
  local_30._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = read<io::basic_string_stream<char,std::char_traits<char>>,io::net::dynamic_vector_buffer<char,std::allocator<char>>,io::net::transfer_exactly,void>
                    (stream,b,completion_condition,&local_30);
  if (local_30._M_value == 0) {
    return sVar1;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._4_4_ = 0;
  __ec._M_value = local_30._M_value;
  __ec._M_cat = local_30._M_cat;
  std::system_error::system_error(this,__ec,"read");
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::size_t read(SyncReadStream& stream, DynamicBuffer&& b,
                 CompletionCondition completion_condition)
{
    std::error_code ec;
    std::size_t bytes_read = read(stream, std::forward<DynamicBuffer>(b),
                                  completion_condition, ec);
    if (ec) throw std::system_error(ec, __func__);
    return bytes_read;
}